

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

RegSlot __thiscall
ByteCodeGenerator::DefineOneFunction
          (ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc,FuncInfo *funcInfoParent,
          bool generateAssignment,RegSlot regEnv,RegSlot frameDisplayTemp)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot RVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  Symbol *this_00;
  Scope *pSVar8;
  FunctionBody *this_01;
  CharacterBuffer<char16_t> *propName;
  bool isFunctionDeclarationInBlock;
  Symbol *funcSymbol;
  RegSlot local_30;
  RegSlot frameDisplayTemp_local;
  RegSlot regEnv_local;
  bool generateAssignment_local;
  FuncInfo *funcInfoParent_local;
  ParseNodeFnc *pnodeFnc_local;
  ByteCodeGenerator *this_local;
  
  if ((pnodeFnc->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x4c9,"(pnodeFnc->nop == knopFncDecl)","pnodeFnc->nop == knopFncDecl");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  FuncInfo::AcquireLoc(funcInfoParent,&pnodeFnc->super_ParseNode);
  local_30 = regEnv;
  if (regEnv == 0xffffffff) {
    local_30 = frameDisplayTemp;
    if (frameDisplayTemp == 0xffffffff) {
      if (funcInfoParent->frameDisplayRegister == 0xffffffff) {
        local_30 = FuncInfo::GetEnvRegister(funcInfoParent);
      }
      else {
        local_30 = funcInfoParent->frameDisplayRegister;
      }
    }
    local_30 = PrependLocalScopes(this,local_30,0xffffffff,funcInfoParent);
  }
  if (pnodeFnc->nestedIndex == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x4e7,"(pnodeFnc->nestedIndex != (uint)-1)",
                       "pnodeFnc->nestedIndex != (uint)-1");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((local_30 == funcInfoParent->frameDisplayRegister) ||
     (RVar5 = FuncInfo::GetEnvRegister(funcInfoParent), local_30 == RVar5)) {
    RVar5 = (pnodeFnc->super_ParseNode).location;
    uVar1 = pnodeFnc->nestedIndex;
    bVar3 = ParseNodeFnc::IsCoroutine(pnodeFnc);
    RVar6 = ParseNodeFnc::GetHomeObjLocation(pnodeFnc);
    Js::ByteCodeWriter::NewFunction(&this->m_writer,RVar5,uVar1,bVar3,RVar6);
  }
  else {
    RVar5 = (pnodeFnc->super_ParseNode).location;
    uVar1 = pnodeFnc->nestedIndex;
    bVar3 = ParseNodeFnc::IsCoroutine(pnodeFnc);
    RVar6 = ParseNodeFnc::GetHomeObjLocation(pnodeFnc);
    Js::ByteCodeWriter::NewInnerFunction(&this->m_writer,RVar5,uVar1,local_30,bVar3,RVar6);
  }
  bVar3 = FuncInfo::IsGlobalFunction(funcInfoParent);
  if ((bVar3) && ((this->flags & 0x400) != 0)) {
    this->funcEscapes = true;
  }
  else {
    bVar3 = ParseNodeFnc::IsDeclaration(pnodeFnc);
    if ((bVar3) && (this_00 = ParseNodeFnc::GetFuncSymbol(pnodeFnc), this_00 != (Symbol *)0x0)) {
      pSVar8 = FuncInfo::GetBodyScope(funcInfoParent);
      if ((pSVar8 == (Scope *)0x0) || (pSVar8 = Symbol::GetScope(this_00), pSVar8 == (Scope *)0x0))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x511,
                           "(funcInfoParent->GetBodyScope() != nullptr && funcSymbol->GetScope() != nullptr)"
                           ,
                           "funcInfoParent->GetBodyScope() != nullptr && funcSymbol->GetScope() != nullptr"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar3 = Symbol::GetIsBlockVar(this_00);
      bVar4 = ShouldTrackDebuggerMetadata(this);
      if ((bVar4) &&
         (((bVar4 = FuncInfo::IsGlobalFunction(funcInfoParent), !bVar4 || (bVar3)) &&
          (bVar4 = Symbol::IsInSlot(this_00,this,funcInfoParent,false), !bVar4)))) {
        this_01 = Js::FunctionProxy::GetFunctionBody
                            (&funcInfoParent->byteCodeFunction->super_FunctionProxy);
        propName = Symbol::GetName(this_00);
        Js::FunctionBody::InsertSymbolToRegSlotList
                  (this_01,propName,(pnodeFnc->super_ParseNode).location,
                   funcInfoParent->varRegsCount);
      }
      if (bVar3) {
        TrackFunctionDeclarationPropertyForDebugger(this,this_00,funcInfoParent);
      }
    }
  }
  bVar3 = ParseNodeFnc::IsDefaultModuleExport(pnodeFnc);
  if (bVar3) {
    EmitAssignmentToDefaultModuleExport(this,&pnodeFnc->super_ParseNode,funcInfoParent);
  }
  if ((pnodeFnc->pnodeName != (ParseNodeVar *)0x0) && (generateAssignment)) {
    EmitAssignmentToFuncName(pnodeFnc,this,funcInfoParent);
  }
  return local_30;
}

Assistant:

Js::RegSlot ByteCodeGenerator::DefineOneFunction(ParseNodeFnc *pnodeFnc, FuncInfo *funcInfoParent, bool generateAssignment, Js::RegSlot regEnv, Js::RegSlot frameDisplayTemp)
{
    Assert(pnodeFnc->nop == knopFncDecl);

    funcInfoParent->AcquireLoc(pnodeFnc);

    if (regEnv == Js::Constants::NoRegister)
    {
        // If the child needs a closure, find a heap-allocated frame to pass to it.
        if (frameDisplayTemp != Js::Constants::NoRegister)
        {
            // We allocated a temp to hold a local frame display value. Use that.
            // It's likely that the FD is on the stack, and we used the temp to load it back.
            regEnv = frameDisplayTemp;
        }
        else if (funcInfoParent->frameDisplayRegister != Js::Constants::NoRegister)
        {
            // This function has built a frame display, so pass it down.
            regEnv = funcInfoParent->frameDisplayRegister;
        }
        else
        {
            // This function has no captured locals but inherits a closure environment, so pass it down.
            regEnv = funcInfoParent->GetEnvRegister();
        }

        regEnv = this->PrependLocalScopes(regEnv, Js::Constants::NoRegister, funcInfoParent);
    }

    // AssertMsg(funcInfo->nonLocalSymbols == 0 || regEnv != funcInfoParent->nullConstantRegister,
    // "We need a closure for the nested function");

    Assert(pnodeFnc->nestedIndex != (uint)-1);

    // If we are in a parameter scope and it is not merged with body scope then we have to create the child function as an inner function
    if (regEnv == funcInfoParent->frameDisplayRegister || regEnv == funcInfoParent->GetEnvRegister())
    {
        m_writer.NewFunction(pnodeFnc->location, pnodeFnc->nestedIndex, pnodeFnc->IsCoroutine(), pnodeFnc->GetHomeObjLocation());
    }
    else
    {
        m_writer.NewInnerFunction(pnodeFnc->location, pnodeFnc->nestedIndex, regEnv, pnodeFnc->IsCoroutine(), pnodeFnc->GetHomeObjLocation());
    }

    if (funcInfoParent->IsGlobalFunction() && (this->flags & fscrEval))
    {
        // A function declared at global scope in eval is untrackable,
        // so make sure the caller's cached scope is invalidated.
        this->funcEscapes = true;
    }
    else
    {
        if (pnodeFnc->IsDeclaration())
        {
            Symbol * funcSymbol = pnodeFnc->GetFuncSymbol();
            if (funcSymbol)
            {
                // In the case where a let/const declaration is the same symbol name
                // as the function declaration (shadowing case), the let/const var and
                // the function declaration symbol are the same and share the same flags
                // (particularly, sym->GetIsBlockVar() for this code path).
                //
                // For example:
                // let a = 0;       // <-- sym->GetIsBlockVar() = true
                // function b(){}   // <-- sym2->GetIsBlockVar() = false
                //
                // let x = 0;       // <-- sym3->GetIsBlockVar() = true
                // function x(){}   // <-- sym3->GetIsBlockVar() = true
                //
                // In order to tell if the function is actually part
                // of a block scope, we compare against the function scope here.
                // Note that having a function with the same name as a let/const declaration
                // is a redeclaration error, but we're pushing the fix for this out since it's
                // a bit involved.
                Assert(funcInfoParent->GetBodyScope() != nullptr && funcSymbol->GetScope() != nullptr);
                bool isFunctionDeclarationInBlock = funcSymbol->GetIsBlockVar();

                // Track all vars/lets/consts register slot function declarations.
                if (ShouldTrackDebuggerMetadata()
                    // If this is a let binding function declaration at global level, we want to
                    // be sure to track the register location as well.
                    && !(funcInfoParent->IsGlobalFunction() && !isFunctionDeclarationInBlock))
                {
                    if (!funcSymbol->IsInSlot(this, funcInfoParent))
                    {
                        funcInfoParent->byteCodeFunction->GetFunctionBody()->InsertSymbolToRegSlotList(funcSymbol->GetName(), pnodeFnc->location, funcInfoParent->varRegsCount);
                    }
                }

                if (isFunctionDeclarationInBlock)
                {
                    // We only track inner let bindings for the debugger side.
                    this->TrackFunctionDeclarationPropertyForDebugger(funcSymbol, funcInfoParent);
                }
            }
        }
    }

    if (pnodeFnc->IsDefaultModuleExport())
    {
        this->EmitAssignmentToDefaultModuleExport(pnodeFnc, funcInfoParent);
    }

    if (pnodeFnc->pnodeName == nullptr || !generateAssignment)
    {
        return regEnv;
    }

    EmitAssignmentToFuncName(pnodeFnc, this, funcInfoParent);

    return regEnv;
}